

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O2

Fl_Double_Window * make_class_panel(void)

{
  uint *puVar1;
  Fl_Input *pFVar2;
  Fl_Light_Button *pFVar3;
  Fl_Double_Window *pFVar4;
  Fl_Group *pFVar5;
  Fl_Widget *pFVar6;
  Fl_Group *pFVar7;
  Fl_Text_Editor *pFVar8;
  Fl_Text_Buffer *this;
  Fl_Window *this_00;
  Fl_Button *this_01;
  
  pFVar4 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar4,0x156,0xc4,"Class Properties");
  class_panel = pFVar4;
  (pFVar4->super_Fl_Window).super_Fl_Group.super_Fl_Widget.label_.size = 0xb;
  pFVar5 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar5,10,10,0x118,0x14,(char *)0x0);
  (*(pFVar5->super_Fl_Widget)._vptr_Fl_Widget[6])(pFVar5);
  pFVar6 = (Fl_Widget *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button((Fl_Light_Button *)pFVar6,10,10,0x3c,0x14,"public");
  c_public_button = (Fl_Light_Button *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Make the class publicly accessible.");
  pFVar3 = c_public_button;
  (c_public_button->super_Fl_Button).super_Fl_Widget.label_.size = 0xb;
  (pFVar3->super_Fl_Button).super_Fl_Widget.when_ = '\0';
  (*(pFVar3->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[6])();
  pFVar6 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar6,0x50,10,0xd2,0x14,(char *)0x0);
  pFVar7 = Fl_Group::current();
  pFVar7->resizable_ = pFVar6;
  Fl_Group::end(pFVar5);
  pFVar6 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar6,10,0x14,0x140,0x14,"Name:");
  c_name_input = (Fl_Input *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Name of class.");
  pFVar2 = c_name_input;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.size = 0xb;
  (pFVar2->super_Fl_Input_).textfont_ = 4;
  (pFVar2->super_Fl_Input_).textsize_ = 0xb;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.align_ = 5;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.when_ = '\0';
  pFVar6 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar6,10,0x37,0x140,0x14,"Subclass of (text between : and {)");
  c_subclass_input = (Fl_Input *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Name of subclass.");
  pFVar2 = c_subclass_input;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.size = 0xb;
  (pFVar2->super_Fl_Input_).textfont_ = 4;
  (pFVar2->super_Fl_Input_).textsize_ = 0xb;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.align_ = 5;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.when_ = '\0';
  pFVar8 = (Fl_Text_Editor *)operator_new(0x1c0);
  Fl_Text_Editor::Fl_Text_Editor(pFVar8,10,0x5a,0x140,0x41,"Comment:");
  c_comment_input = pFVar8;
  Fl_Widget::tooltip((Fl_Widget *)pFVar8,"Class comment in Doxygen format");
  pFVar8 = c_comment_input;
  (c_comment_input->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.box_ = '\x03';
  (pFVar8->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.label_.font = 1;
  (pFVar8->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.label_.size = 0xb;
  (pFVar8->super_Fl_Text_Display).textfont_ = 4;
  (pFVar8->super_Fl_Text_Display).textsize_ = 0xb;
  (pFVar8->super_Fl_Text_Display).mColumnScale = 0.0;
  (pFVar8->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.label_.align_ = 5;
  pFVar5 = Fl_Group::current();
  pFVar8 = c_comment_input;
  pFVar5->resizable_ = (Fl_Widget *)c_comment_input;
  this = (Fl_Text_Buffer *)operator_new(0x88);
  Fl_Text_Buffer::Fl_Text_Buffer(this,0,0x400);
  Fl_Text_Display::buffer(&pFVar8->super_Fl_Text_Display,this);
  Fl_Text_Editor::add_key_binding(c_comment_input,0xff09,0,use_tab_navigation);
  pFVar5 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar5,10,0xa5,0x140,0x14,(char *)0x0);
  pFVar6 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar6,200,0xa5,0x3c,0x14,"OK");
  c_panel_ok = (Fl_Return_Button *)pFVar6;
  (pFVar6->label_).size = 0xb;
  this_00 = Fl_Widget::window(pFVar6);
  Fl_Window::hotspot(this_00,(Fl_Widget *)c_panel_ok,0);
  this_01 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_01,0x10e,0xa5,0x3c,0x14,"Cancel");
  c_panel_cancel = this_01;
  this_01->shortcut_ = 0xff1b;
  (this_01->super_Fl_Widget).label_.size = 0xb;
  pFVar6 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar6,10,0xa5,0xb9,0x14,(char *)0x0);
  pFVar7 = Fl_Group::current();
  pFVar7->resizable_ = pFVar6;
  Fl_Group::end(pFVar5);
  pFVar4 = class_panel;
  puVar1 = &(class_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x4000;
  (pFVar4->super_Fl_Window).minw = 0x157;
  (pFVar4->super_Fl_Window).minh = 0xbc;
  (pFVar4->super_Fl_Window).maxw = 0;
  (pFVar4->super_Fl_Window).maxh = 0;
  (pFVar4->super_Fl_Window).dw = 0;
  (pFVar4->super_Fl_Window).dh = 0;
  (pFVar4->super_Fl_Window).aspect = 0;
  Fl_Window::size_range_(&pFVar4->super_Fl_Window);
  Fl_Group::end((Fl_Group *)class_panel);
  return class_panel;
}

Assistant:

Fl_Double_Window* make_class_panel() {
  { class_panel = new Fl_Double_Window(342, 196, "Class Properties");
    class_panel->labelsize(11);
    { Fl_Group* o = new Fl_Group(10, 10, 280, 20);
      o->hide();
      { c_public_button = new Fl_Light_Button(10, 10, 60, 20, "public");
        c_public_button->tooltip("Make the class publicly accessible.");
        c_public_button->labelsize(11);
        c_public_button->when(FL_WHEN_NEVER);
        c_public_button->hide();
      } // Fl_Light_Button* c_public_button
      { Fl_Box* o = new Fl_Box(80, 10, 210, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    { c_name_input = new Fl_Input(10, 20, 320, 20, "Name:");
      c_name_input->tooltip("Name of class.");
      c_name_input->labelfont(1);
      c_name_input->labelsize(11);
      c_name_input->textfont(4);
      c_name_input->textsize(11);
      c_name_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      c_name_input->when(FL_WHEN_NEVER);
    } // Fl_Input* c_name_input
    { c_subclass_input = new Fl_Input(10, 55, 320, 20, "Subclass of (text between : and {)");
      c_subclass_input->tooltip("Name of subclass.");
      c_subclass_input->labelfont(1);
      c_subclass_input->labelsize(11);
      c_subclass_input->textfont(4);
      c_subclass_input->textsize(11);
      c_subclass_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      c_subclass_input->when(FL_WHEN_NEVER);
    } // Fl_Input* c_subclass_input
    { c_comment_input = new Fl_Text_Editor(10, 90, 320, 65, "Comment:");
      c_comment_input->tooltip("Class comment in Doxygen format");
      c_comment_input->box(FL_DOWN_BOX);
      c_comment_input->labelfont(1);
      c_comment_input->labelsize(11);
      c_comment_input->textfont(4);
      c_comment_input->textsize(11);
      c_comment_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      Fl_Group::current()->resizable(c_comment_input);
      c_comment_input->buffer(new Fl_Text_Buffer());
      c_comment_input->add_key_binding(FL_Tab, 0, use_tab_navigation);
    } // Fl_Text_Editor* c_comment_input
    { Fl_Group* o = new Fl_Group(10, 165, 320, 20);
      { c_panel_ok = new Fl_Return_Button(200, 165, 60, 20, "OK");
        c_panel_ok->labelsize(11);
        c_panel_ok->window()->hotspot(c_panel_ok);
      } // Fl_Return_Button* c_panel_ok
      { c_panel_cancel = new Fl_Button(270, 165, 60, 20, "Cancel");
        c_panel_cancel->shortcut(0xff1b);
        c_panel_cancel->labelsize(11);
      } // Fl_Button* c_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 165, 185, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    class_panel->set_modal();
    class_panel->size_range(343, 188);
    class_panel->end();
  } // Fl_Double_Window* class_panel
  return class_panel;
}